

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
Imf_3_4::CompositeDeepScanLine::addSource(CompositeDeepScanLine *this,DeepScanLineInputFile *file)

{
  vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
  *in_RSI;
  value_type *in_RDI;
  DeepScanLineInputFile *in_stack_00000030;
  Header *in_stack_00000078;
  Data *in_stack_00000080;
  
  DeepScanLineInputFile::header(in_stack_00000030);
  Data::check_valid(in_stack_00000080,in_stack_00000078);
  std::vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>::
  push_back(in_RSI,in_RDI);
  return;
}

Assistant:

void
CompositeDeepScanLine::addSource (DeepScanLineInputFile* file)
{
    _Data->check_valid (file->header ());
    _Data->_file.push_back (file);
}